

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  int iVar2;
  int iVar3;
  sqlite3 *db;
  Op *pOVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ushort uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  Mem *pMVar12;
  void *pvVar13;
  VdbeCursor **ppVVar14;
  int *piVar15;
  ushort uVar16;
  ushort uVar17;
  long lVar18;
  long lVar19;
  Mem *pMVar20;
  Mem **ppMVar21;
  ushort uVar22;
  ulong uVar23;
  u64 uVar24;
  int iVar25;
  size_t __n;
  long lVar26;
  long lVar27;
  long lVar28;
  u64 uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  int nArg;
  int local_34;
  
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  db = p->db;
  sVar1 = pParse->nVar;
  iVar2 = pParse->nTab;
  lVar18 = (long)iVar2;
  local_34 = pParse->nMaxArg;
  iVar25 = pParse->nMem + iVar2;
  lVar10 = (long)(p->nOp * 0x18);
  pOVar4 = p->aOp;
  iVar3 = pParse->szOpAlloc;
  resolveP2Values(p,&local_34);
  if (pParse->isMultiWrite == '\0') {
    uVar16 = 0;
  }
  else {
    uVar16 = (ushort)(pParse->mayAbort != '\0') << 5;
  }
  lVar11 = (long)sVar1;
  iVar25 = iVar25 + (uint)(0 < iVar25 && lVar18 == 0);
  uVar30 = iVar3 - lVar10 & 0xfffffffffffffff8;
  uVar8 = (ushort)*(undefined4 *)&p->field_0xc8;
  uVar17 = uVar16 | uVar8 & 0xffdf;
  *(ushort *)&p->field_0xc8 = uVar17;
  if (pParse->explain != 0) {
    if (iVar25 < 0xb) {
      iVar25 = 10;
    }
    uVar22 = (pParse->explain & 3) << 2;
    uVar17 = uVar16 | uVar8 & 0xffd3 | uVar22;
    p->nResColumn = (ushort)(byte)((byte)uVar22 ^ 0xc);
  }
  *(ushort *)&p->field_0xc8 = uVar17 & 0xfffc;
  lVar19 = (long)iVar25;
  lVar28 = lVar19 * 0x38;
  pMVar20 = (Mem *)0x0;
  uVar23 = uVar30 + lVar19 * -0x38;
  pMVar12 = (Mem *)((long)pOVar4 + uVar23 + lVar10);
  lVar5 = 0;
  if (SBORROW8(uVar30,lVar28) != (long)uVar23 < 0) {
    pMVar12 = pMVar20;
    lVar5 = lVar28;
    uVar23 = uVar30;
  }
  p->aMem = pMVar12;
  lVar27 = lVar11 * 0x38;
  uVar30 = uVar23 + lVar11 * -0x38;
  pMVar12 = (Mem *)((long)pOVar4 + uVar30 + lVar10);
  lVar6 = 0;
  if (SBORROW8(uVar23,lVar27) != (long)uVar30 < 0) {
    pMVar12 = pMVar20;
    lVar6 = lVar27;
    uVar30 = uVar23;
  }
  p->aVar = pMVar12;
  lVar31 = (long)local_34;
  lVar32 = lVar31 * 8;
  uVar23 = uVar30 + lVar31 * -8;
  lVar26 = 0;
  if ((long)uVar30 < lVar32) {
    lVar26 = lVar32;
  }
  pMVar12 = (Mem *)((long)pOVar4 + uVar23 + lVar10);
  if (SBORROW8(uVar30,lVar32) != (long)uVar23 < 0) {
    pMVar12 = pMVar20;
    uVar23 = uVar30;
  }
  p->apArg = (Mem **)pMVar12;
  __n = lVar18 * 8;
  pMVar12 = (Mem *)((long)pOVar4 + uVar23 + lVar18 * -8 + lVar10);
  sVar7 = 0;
  if ((long)uVar23 < (long)__n) {
    pMVar12 = pMVar20;
    sVar7 = __n;
  }
  p->apCsr = (VdbeCursor **)pMVar12;
  uVar29 = sVar7 + lVar26 + lVar6 + lVar5;
  if (uVar29 == 0) {
    if (db->mallocFailed != '\0') goto LAB_00126322;
  }
  else {
    pvVar13 = sqlite3DbMallocRawNN(db,uVar29);
    p->pFree = pvVar13;
    if (db->mallocFailed != '\0') {
LAB_00126322:
      p->nVar = 0;
      p->nMem = 0;
      p->nCursor = 0;
      goto LAB_0012641e;
    }
    pMVar12 = p->aMem;
    uVar24 = uVar29;
    if (pMVar12 == (Mem *)0x0) {
      uVar24 = uVar29 + lVar19 * -0x38;
      if ((long)uVar29 < lVar28) {
        pMVar12 = (Mem *)0x0;
        uVar24 = uVar29;
      }
      else {
        pMVar12 = (Mem *)((long)pvVar13 + uVar24);
      }
    }
    p->aMem = pMVar12;
    pMVar12 = p->aVar;
    uVar29 = uVar24;
    if (pMVar12 == (Mem *)0x0) {
      uVar29 = uVar24 + lVar11 * -0x38;
      if (SBORROW8(uVar24,lVar27) == (long)uVar29 < 0) {
        pMVar12 = (Mem *)((long)pvVar13 + uVar29);
      }
      else {
        pMVar12 = (Mem *)0x0;
        uVar29 = uVar24;
      }
    }
    p->aVar = pMVar12;
    ppMVar21 = p->apArg;
    uVar24 = uVar29;
    if (ppMVar21 == (Mem **)0x0) {
      uVar24 = uVar29 + lVar31 * -8;
      if ((long)uVar29 < lVar32) {
        ppMVar21 = (Mem **)0x0;
        uVar24 = uVar29;
      }
      else {
        ppMVar21 = (Mem **)((long)pvVar13 + uVar24);
      }
    }
    p->apArg = ppMVar21;
    ppVVar14 = p->apCsr;
    if (ppVVar14 == (VdbeCursor **)0x0) {
      if ((long)uVar24 < (long)__n) {
        ppVVar14 = (VdbeCursor **)0x0;
      }
      else {
        ppVVar14 = (VdbeCursor **)((long)pvVar13 + uVar24 + lVar18 * -8);
      }
    }
    p->apCsr = ppVVar14;
  }
  p->nCursor = iVar2;
  p->nVar = sVar1;
  if (0 < sVar1) {
    uVar9 = (int)sVar1 + 1;
    piVar15 = &p->aVar->szMalloc;
    do {
      *(u16 *)(piVar15 + -3) = 1;
      *(sqlite3 **)(piVar15 + -2) = db;
      *piVar15 = 0;
      uVar9 = uVar9 - 1;
      piVar15 = piVar15 + 0xe;
    } while (1 < uVar9);
  }
  p->nMem = iVar25;
  if (0 < iVar25) {
    uVar9 = iVar25 + 1;
    piVar15 = &p->aMem->szMalloc;
    do {
      *(u16 *)(piVar15 + -3) = 0;
      *(sqlite3 **)(piVar15 + -2) = db;
      *piVar15 = 0;
      uVar9 = uVar9 - 1;
      piVar15 = piVar15 + 0xe;
    } while (1 < uVar9);
  }
  memset(p->apCsr,0,__n);
LAB_0012641e:
  p->eVdbeState = '\x01';
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->nChange = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->iStatement = 0;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    p->nResColumn = 12 - 4*p->explain;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
  }
  sqlite3VdbeRewind(p);
}